

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.cpp
# Opt level: O0

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  long in_RDX;
  int in_ESI;
  args_t *in_RDI;
  char *arg;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_1c;
  
  in_RDI->output = _stdout;
  in_RDI->input1 = _stdin;
  in_RDI->input2 = (FILE *)0x0;
  in_RDI->distance = 0.015;
  in_RDI->min_distance = -1e-10;
  in_RDI->ambig = resolve;
  in_RDI->format = csv;
  in_RDI->overlap = 100;
  in_RDI->do_bootstrap = false;
  in_RDI->do_bootstrap_two_files = false;
  in_RDI->do_count = false;
  in_RDI->quiet = false;
  in_RDI->do_fst = false;
  in_RDI->skip_header = false;
  in_RDI->report_self = false;
  in_RDI->counts_in_name = ':';
  in_RDI->include_prob = 1.0;
  in_RDI->ambigs_to_resolve = (char *)0x0;
  in_RDI->resolve_fraction = 1.0;
  in_RDI->delimiter = ',';
  for (local_1c = 1; local_1c < in_ESI; local_1c = local_1c + 1) {
    pcVar1 = *(char **)(in_RDX + (long)local_1c * 8);
    if ((*pcVar1 == '-') && (pcVar1[1] == '-')) {
      iVar2 = strcmp(pcVar1 + 2,"help");
      if (iVar2 == 0) {
        help();
      }
      else {
        iVar2 = strcmp(pcVar1 + 2,"version");
        if (iVar2 == 0) {
          version();
        }
        else {
          ERROR("unknown argument: %s",pcVar1);
        }
      }
    }
    else if (*pcVar1 == '-') {
      iVar2 = strcmp(pcVar1 + 1,"h");
      if (iVar2 == 0) {
        help();
      }
      else if (pcVar1[1] == 'v') {
        version();
      }
      else if (pcVar1[1] == 'o') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c5e3);
        parse_output(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 't') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c616);
        parse_distance(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
        ;
      }
      else if (pcVar1[1] == 'w') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c649);
        parse_min_distance(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 'l') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c67c);
        parse_overlap(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 'f') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c6af);
        parse_format(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 'a') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c6e2);
        parse_ambig(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 's') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c715);
        parse_second_in(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       );
      }
      else if (pcVar1[1] == 'd') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c748);
        parse_counts_in_name
                  (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 'u') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c77b);
        parse_include_prob(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 'D') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c7ae);
        parse_delimiter(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       );
      }
      else if (pcVar1[1] == 'b') {
        parse_bootstrap(in_RDI);
      }
      else if (pcVar1[1] == 'r') {
        parse_bootstrap_two_files(in_RDI);
      }
      else if (pcVar1[1] == 'c') {
        parse_count(in_RDI);
      }
      else if (pcVar1[1] == 'n') {
        parse_no_header(in_RDI);
      }
      else if (pcVar1[1] == 'q') {
        parse_quiet(in_RDI);
      }
      else if (pcVar1[1] == 'm') {
        parse_fst(in_RDI);
      }
      else if (pcVar1[1] == '0') {
        parse_report_self(in_RDI);
      }
      else if (pcVar1[1] == 'g') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x10c8a3);
        parse_fraction(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
        ;
      }
      else {
        ERROR("unknown argument: %s",pcVar1);
      }
    }
    else if (local_1c == in_ESI + -1) {
      parse_input(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      ERROR("unknown argument: %s",pcVar1);
    }
  }
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
  output( stdout ),
  input1( stdin ),
  input2( NULL ),
  distance( DEFAULT_DISTANCE ),
  min_distance( DEFAULT_MIN_DISTANCE ),
  ambig( DEFAULT_AMBIG ),
  format ( DEFAULT_FORMAT ),
  overlap ( DEFAULT_OVERLAP ),
  do_bootstrap( false ),
  do_bootstrap_two_files ( false ),
  do_count( false ),
  quiet( false ),
  do_fst( false ),
  skip_header ( false ),
  report_self ( false ),
  counts_in_name ( DEFAULT_COUNTS_IN_NAME ),
  include_prob( DEFAULT_INCLUDE_PROB ),
  ambigs_to_resolve(NULL),
  resolve_fraction(DEFAULT_FRACTION),
  delimiter (DEFAULT_DELIMITER)
  {
      // skip arg[0], it's just the program name
    for (int i = 1; i < argc; ++i ) {
      const char * arg = argv[i];
      
      if ( arg[0] == '-' && arg[1] == '-' ) {
        if ( !strcmp( &arg[2], "help" ) ) help();
        else if ( !strcmp( &arg[2], "version" ) ) version();
        else
          ERROR( "unknown argument: %s", arg );
      }
      else if ( arg[0] == '-' ) {
        if ( !strcmp( &arg[1], "h" ) ) help();
        else if (  arg[1] == 'v' ) version();
        else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
        else if (  arg[1] == 't' ) parse_distance ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'w' ) parse_min_distance ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'l')  parse_overlap( next_arg (i, argc, argv) );
        else if (  arg[1] == 'f')  parse_format( next_arg (i, argc, argv) );
        else if (  arg[1] == 'a')  parse_ambig( next_arg (i, argc, argv) );
        else if (  arg[1] == 's')  parse_second_in( next_arg (i, argc, argv) );
        else if (  arg[1] == 'd')  parse_counts_in_name( next_arg (i, argc, argv) );
        else if (  arg[1] == 'u')  parse_include_prob( next_arg (i, argc, argv) );
        else if (  arg[1] == 'D')  parse_delimiter ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'b')  parse_bootstrap();
        else if (  arg[1] == 'r')  parse_bootstrap_two_files ();
        else if (  arg[1] == 'c')  parse_count();
        else if (  arg[1] == 'n')  parse_no_header ();
        else if (  arg[1] == 'q')  parse_quiet();
        else if (  arg[1] == 'm')  parse_fst();
        else if (  arg[1] == '0')  parse_report_self();
        else if (  arg[1] == 'g')  parse_fraction( next_arg (i, argc, argv) );
        else
          ERROR( "unknown argument: %s", arg );
      }
      else
        if (i == argc-1) {
          parse_input (arg);
        } else {
          ERROR( "unknown argument: %s", arg );
        }
    }
  }